

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setImageLimited<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  store_t sVar1;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  int *in_RDI;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long i;
  long k;
  int j;
  long local_28;
  long local_20;
  int local_14;
  
  getWidth(in_RSI);
  getHeight(in_RSI);
  getDepth(in_RSI);
  setSize((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)i,in_stack_00000018,
          in_stack_00000010,in_stack_00000008);
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    for (local_20 = 0; local_20 < *(long *)(in_RDI + 4); local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < *(long *)(in_RDI + 2); local_28 = local_28 + 1) {
        get(in_RSI,local_28,local_20,local_14);
        sVar1 = PixelTraits<unsigned_char>::limit((work_t)((ulong)in_RDI >> 0x20));
        *(store_t *)
         (*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_14 * 8) + local_20 * 8) +
         local_28) = sVar1;
      }
    }
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }